

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doPrintDefinition(DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                    *this,ostream *os)

{
  pointer pSVar1;
  long *plVar2;
  Expr<float> *pEVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  ostream *poVar6;
  size_t ndx;
  ulong uVar7;
  long lVar8;
  string asStack_48 [32];
  
  iVar4 = (*(this->
            super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            ).super_FuncBase._vptr_FuncBase[10])();
  initialize(this);
  pcVar5 = dataTypeNameOf<float>();
  poVar6 = std::operator<<(os,pcVar5);
  poVar6 = std::operator<<(poVar6," ");
  (*(this->
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).super_FuncBase._vptr_FuncBase[2])(asStack_48,this);
  poVar6 = std::operator<<(poVar6,asStack_48);
  std::operator<<(poVar6,"(");
  std::__cxx11::string::~string(asStack_48);
  pcVar5 = dataTypeNameOf<float>();
  poVar6 = std::operator<<(os,pcVar5);
  poVar6 = std::operator<<(poVar6," ");
  std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar4));
  poVar6 = std::operator<<(os,", ");
  pcVar5 = dataTypeNameOf<float>();
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6," ");
  std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar4) + 0x20);
  std::operator<<(os,")\n{\n");
  lVar8 = 0;
  uVar7 = 0;
  while( true ) {
    pSVar1 = (this->m_body).
             super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_body).
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4) <= uVar7)
    break;
    plVar2 = *(long **)((long)&(pSVar1->super_SharedPtr<const_vkt::shaderexecutor::Statement>).m_ptr
                       + lVar8);
    (**(code **)(*plVar2 + 0x10))(plVar2,os);
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 0x10;
  }
  poVar6 = std::operator<<(os,"return ");
  pEVar3 = (this->m_ret).super_ExprPBase<float>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[2])(pEVar3,poVar6);
  std::operator<<(poVar6,";\n");
  std::operator<<(os,"}\n");
  return;
}

Assistant:

void						doPrintDefinition	(ostream& os) const
	{
		const ParamNames&	paramNames	= this->getParamNames();

		initialize();

		os << dataTypeNameOf<Ret>() << " " << this->getName()
			<< "(";
		if (isTypeValid<Arg0>())
			os << dataTypeNameOf<Arg0>() << " " << paramNames.a;
		if (isTypeValid<Arg1>())
			os << ", " << dataTypeNameOf<Arg1>() << " " << paramNames.b;
		if (isTypeValid<Arg2>())
			os << ", " << dataTypeNameOf<Arg2>() << " " << paramNames.c;
		if (isTypeValid<Arg3>())
			os << ", " << dataTypeNameOf<Arg3>() << " " << paramNames.d;
		os << ")\n{\n";

		for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
			os << *m_body[ndx];
		os << "return " << *m_ret << ";\n";
		os << "}\n";
	}